

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# close.c
# Opt level: O0

void lws_inform_client_conn_fail(lws *wsi,void *arg,size_t len)

{
  size_t len_local;
  void *arg_local;
  lws *wsi_local;
  
  lws_addrinfo_clean(wsi);
  if ((*(ulong *)&wsi->field_0x2dc >> 0x16 & 1) == 0) {
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffbfffff | 0x400000;
    lws_stats_bump(wsi->context->pt + (int)wsi->tsi,0x19,1);
    if (wsi->protocol != (lws_protocols *)0x0) {
      (*wsi->protocol->callback)(wsi,LWS_CALLBACK_CLIENT_CONNECTION_ERROR,wsi->user_space,arg,len);
    }
  }
  return;
}

Assistant:

void
lws_inform_client_conn_fail(struct lws *wsi, void *arg, size_t len)
{
	lws_addrinfo_clean(wsi);

	if (wsi->already_did_cce)
		return;

	wsi->already_did_cce = 1;
	lws_stats_bump(&wsi->context->pt[(int)wsi->tsi],
		       LWSSTATS_C_CONNS_CLIENT_FAILED, 1);

	if (!wsi->protocol)
		return;

	wsi->protocol->callback(wsi,
			        LWS_CALLBACK_CLIENT_CONNECTION_ERROR,
				wsi->user_space, arg, len);
}